

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_distefano_1999.h
# Opt level: O0

double __thiscall DiStefano::Alloc(DiStefano *this)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  ulong uVar3;
  int *piVar4;
  bool *pbVar5;
  double dVar6;
  double dVar7;
  double ma_t;
  double t;
  Size local_78;
  Mat_<int> local_70;
  DiStefano *local_10;
  DiStefano *this_local;
  
  local_10 = this;
  PerformanceEvaluator::start
            (&(this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_);
  cv::MatSize::operator()((MatSize *)&local_78);
  cv::Mat_<int>::Mat_(&local_70,&local_78);
  cv::Mat_<int>::operator=((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_,&local_70)
  ;
  cv::Mat_<int>::~Mat_(&local_70);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)((*(int *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->
                                  field_0x8 + 1) / 2) *
                 (long)((*(int *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->
                                  field_0xc + 1) / 2) + 1;
  uVar3 = SUB168(auVar1 * ZEXT816(4),0);
  if (SUB168(auVar1 * ZEXT816(4),8) != 0) {
    uVar3 = 0xffffffffffffffff;
  }
  piVar4 = (int *)operator_new__(uVar3);
  this->a_class = piVar4;
  pbVar5 = (bool *)operator_new__((long)((*(int *)&((this->
                                                  super_Labeling2D<(Connectivity2D)8,_false>).img_)
                                                  ->field_0x8 + 1) / 2) *
                                  (long)((*(int *)&((this->
                                                  super_Labeling2D<(Connectivity2D)8,_false>).img_)
                                                  ->field_0xc + 1) / 2) + 1);
  this->a_single = pbVar5;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = (long)((*(int *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->
                                  field_0x8 + 1) / 2) *
                 (long)((*(int *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->
                                  field_0xc + 1) / 2) + 1;
  uVar3 = SUB168(auVar2 * ZEXT816(4),0);
  if (SUB168(auVar2 * ZEXT816(4),8) != 0) {
    uVar3 = 0xffffffffffffffff;
  }
  piVar4 = (int *)operator_new__(uVar3);
  this->a_renum = piVar4;
  memset(*(void **)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->field_0x10,0,
         *(long *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->field_0x20 -
         *(long *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->field_0x18);
  memset(this->a_class,0,
         ((long)((*(int *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x8 + 1)
                / 2) *
          (long)((*(int *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0xc + 1)
                / 2) + 1) * 4);
  memset(this->a_single,0,
         (long)((*(int *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x8 + 1)
               / 2) *
         (long)((*(int *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0xc + 1)
               / 2) + 1);
  memset(this->a_renum,0,
         ((long)((*(int *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x8 + 1)
                / 2) *
          (long)((*(int *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0xc + 1)
                / 2) + 1) * 4);
  PerformanceEvaluator::stop
            (&(this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_);
  dVar6 = PerformanceEvaluator::last
                    (&(this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_);
  PerformanceEvaluator::start
            (&(this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_);
  memset(*(void **)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->field_0x10,0,
         *(long *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->field_0x20 -
         *(long *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->field_0x18);
  memset(this->a_class,0,
         ((long)((*(int *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x8 + 1)
                / 2) *
          (long)((*(int *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0xc + 1)
                / 2) + 1) * 4);
  memset(this->a_single,0,
         (long)((*(int *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x8 + 1)
               / 2) *
         (long)((*(int *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0xc + 1)
               / 2) + 1);
  memset(this->a_renum,0,
         ((long)((*(int *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x8 + 1)
                / 2) *
          (long)((*(int *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0xc + 1)
                / 2) + 1) * 4);
  PerformanceEvaluator::stop
            (&(this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_);
  dVar7 = PerformanceEvaluator::last
                    (&(this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_);
  return dVar6 - dVar7;
}

Assistant:

double Alloc()
    {
        // Memory allocation for the output image
        perf_.start();
        img_labels_ = cv::Mat1i(img_.size());
        a_class = new int[UPPER_BOUND_8_CONNECTIVITY];
        a_single = new bool[UPPER_BOUND_8_CONNECTIVITY];
        a_renum = new int[UPPER_BOUND_8_CONNECTIVITY];
        memset(img_labels_.data, 0, img_labels_.dataend - img_labels_.datastart);
        memset(a_class, 0, UPPER_BOUND_8_CONNECTIVITY * sizeof(int));
        memset(a_single, 0, UPPER_BOUND_8_CONNECTIVITY * sizeof(bool));
        memset(a_renum, 0, UPPER_BOUND_8_CONNECTIVITY * sizeof(int));
        perf_.stop();
        double t = perf_.last();
        perf_.start();
        memset(img_labels_.data, 0, img_labels_.dataend - img_labels_.datastart);
        memset(a_class, 0, UPPER_BOUND_8_CONNECTIVITY * sizeof(int));
        memset(a_single, 0, UPPER_BOUND_8_CONNECTIVITY * sizeof(bool));
        memset(a_renum, 0, UPPER_BOUND_8_CONNECTIVITY * sizeof(int));
        perf_.stop();
        double ma_t = t - perf_.last();
        // Return total time
        return ma_t;
    }